

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O1

int_t mc64sd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *numx,int_t *w,
             int_t *len,int_t *lenl,int_t *lenh,int_t *fc,int_t *iw,int_t *iw4)

{
  int_t *piVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int_t iVar15;
  int_t *piVar16;
  double dVar17;
  double dVar18;
  int local_b8;
  uint local_b4;
  int_t *local_b0;
  uint *local_a8;
  double local_a0;
  int_t nval;
  int_t cnt;
  double local_90;
  int_t *local_88;
  int local_80;
  int_t mod;
  int_t *local_78;
  int local_6c;
  int local_68;
  uint local_64;
  int *local_60;
  int *local_58;
  int_t *local_50;
  ulong local_48;
  double local_40;
  ulong local_38;
  
  local_50 = iw4 + -1;
  local_78 = irn;
  local_58 = ne;
  local_90 = dmach("Overflow");
  uVar4 = *n;
  if (0 < (int)uVar4) {
    lVar3 = 1;
    do {
      fc[lVar3 + -1] = (int_t)lVar3;
      iw[lVar3 + -1] = 0;
      len[lVar3 + -1] = ip[lVar3] - ip[lVar3 + -1];
      lVar3 = lVar3 + 1;
    } while ((ulong)uVar4 + 1 != lVar3);
  }
  cnt = 1;
  mod = 1;
  *numx = 0;
  iVar6 = *n;
  local_a8 = (uint *)n;
  local_88 = ip;
  mc64ud_(&cnt,&mod,n,local_78,local_50 + (long)iVar6 + 1,ip,len,fc,iw,numx,n,iw4,
          local_50 + (long)iVar6 + 1,local_50 + (int)(iVar6 * 2 | 1),local_50 + (long)iVar6 * 3 + 1)
  ;
  local_b4 = *numx;
  uVar4 = *n;
  if (local_b4 == uVar4) {
    if (0 < (int)uVar4) {
      lVar3 = 1;
      do {
        lVar8 = (long)local_88[lVar3 + -1];
        dVar17 = 0.0;
        if (local_88[lVar3 + -1] < local_88[lVar3]) {
          dVar18 = 0.0;
          do {
            dVar17 = a[lVar8 + -1];
            if (a[lVar8 + -1] <= dVar18) {
              dVar17 = dVar18;
            }
            lVar8 = lVar8 + 1;
            dVar18 = dVar17;
          } while (local_88[lVar3] != lVar8);
        }
        lVar3 = lVar3 + 1;
        if (local_90 <= dVar17) {
          dVar17 = local_90;
        }
        local_90 = dVar17;
      } while (lVar3 != (ulong)uVar4 + 1);
    }
    local_90 = local_90 * 1.0010000467300415;
  }
  local_b0 = w + -1;
  local_a0 = 0.0;
  if ((int)uVar4 < 1) {
    local_b8 = 0;
  }
  else {
    local_b8 = 0;
    uVar14 = 1;
    do {
      iVar5 = local_88[uVar14] - local_88[uVar14 - 1];
      lenh[uVar14 - 1] = iVar5;
      len[uVar14 - 1] = iVar5;
      iVar6 = local_88[uVar14 - 1];
      iVar2 = local_88[uVar14];
      iVar7 = iVar2;
      if (iVar6 < iVar2) {
        pdVar10 = a + (long)iVar6 + -1;
        iVar11 = iVar6;
        do {
          iVar7 = iVar11;
          if (*pdVar10 <= local_90 && local_90 != *pdVar10) break;
          iVar11 = iVar11 + 1;
          pdVar10 = pdVar10 + 1;
          iVar7 = iVar2;
        } while (iVar2 != iVar11);
      }
      lenl[uVar14 - 1] = iVar7 - iVar6;
      if (iVar7 - iVar6 != iVar5) {
        lVar3 = (long)local_b8;
        local_b8 = local_b8 + 1;
        w[lVar3] = (int_t)uVar14;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar4 + 1);
  }
  piVar1 = iw + -1;
  local_6c = *local_58;
  if (0 < local_6c) {
    local_40 = 0.0;
    local_48 = 1;
    piVar16 = local_88;
    iVar15 = cnt;
    local_60 = iperm;
    iVar6 = local_b8;
    do {
      if (local_b4 == *numx) {
        uVar4 = *local_a8;
        if (0 < (int)uVar4) {
          uVar14 = 0;
          do {
            iperm[uVar14] = iw[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar4 != uVar14);
        }
        local_68 = *local_58;
        uVar14 = (ulong)local_b4;
        uVar4 = local_b4;
        if (0 < local_68) {
          local_38 = 1;
          local_80 = iVar15;
          do {
            local_40 = local_a0;
            if (((local_90 == local_a0) && (!NAN(local_90) && !NAN(local_a0))) ||
               (mc64qd_(piVar16,lenl,len,w,&local_b8,a,&nval,&local_a0), nval < 2)) {
              local_b4 = (uint)uVar14;
              iperm = local_60;
              goto LAB_00114806;
            }
            local_64 = *local_a8;
            local_b8 = iVar6;
            if ((0 < (int)local_64) && (0 < iVar6)) {
              iVar2 = 1;
              iVar7 = 1;
              do {
                iVar11 = local_b0[iVar7];
                iVar5 = len[(long)iVar11 + -1] + piVar16[(long)iVar11 + -1];
                if (lenl[(long)iVar11 + -1] < len[(long)iVar11 + -1]) {
                  iVar5 = iVar5 + -1;
                  iVar12 = lenl[(long)iVar11 + -1] + piVar16[(long)iVar11 + -1];
                  iVar13 = iVar12;
                  if (iVar5 < iVar12) {
                    iVar13 = iVar5;
                  }
                  lVar3 = (long)iVar5 + 1;
                  do {
                    iVar9 = iVar5;
                    if (local_a0 <= a[lVar3 + -2]) break;
                    if (piVar1[local_78[lVar3 + -2]] == iVar11) {
                      piVar1[local_78[lVar3 + -2]] = 0;
                      uVar14 = (long)(int)uVar14 - 1;
                      fc[((long)(int)*local_a8 - uVar14) + -1] = iVar11;
                    }
                    iVar5 = iVar5 + -1;
                    lVar3 = lVar3 + -1;
                    iVar9 = iVar13 + -1;
                  } while (iVar12 < lVar3);
                  iVar5 = iVar9 + 1;
                  piVar16 = local_88;
                }
                lenh[(long)iVar11 + -1] = len[(long)iVar11 + -1];
                len[(long)iVar11 + -1] = iVar5 - piVar16[(long)iVar11 + -1];
                if (lenl[(long)iVar11 + -1] == lenh[(long)iVar11 + -1]) {
                  local_b0[iVar7] = local_b0[iVar6];
                  iVar6 = iVar6 + -1;
                }
                else {
                  iVar7 = iVar7 + 1;
                }
                local_b8 = iVar6;
              } while ((iVar2 < (int)local_64) && (iVar2 = iVar2 + 1, iVar7 <= iVar6));
            }
            uVar4 = (uint)uVar14;
            iVar15 = local_80;
            iVar6 = local_b8;
          } while ((*numx <= (int)uVar4) &&
                  (iVar2 = (int)local_38, local_38 = (ulong)(iVar2 + 1), iVar2 < local_68));
        }
        mod = 1;
        iperm = local_60;
        local_b4 = uVar4;
      }
      else {
        local_90 = local_a0;
        mc64qd_(piVar16,len,lenh,w,&local_b8,a,&nval,&local_a0);
        if (nval == 0) break;
        if ((local_a0 == local_40) && (!NAN(local_a0) && !NAN(local_40))) break;
        uVar4 = *local_a8;
        local_b8 = iVar6;
        if ((0 < (int)uVar4) && (0 < iVar6)) {
          iVar6 = 1;
          iVar2 = 1;
          do {
            lVar3 = (long)local_b0[iVar2];
            iVar5 = piVar16[lVar3 + -1];
            iVar11 = len[lVar3 + -1];
            iVar7 = iVar11 + iVar5;
            if (iVar11 < lenh[lVar3 + -1]) {
              iVar13 = lenh[lVar3 + -1] + iVar5;
              lVar8 = (long)iVar7;
              iVar7 = iVar11 + iVar5 + 1;
              if (iVar7 <= iVar13) {
                iVar7 = iVar13;
              }
              do {
                if (a[lVar8 + -1] <= local_a0 && local_a0 != a[lVar8 + -1]) {
                  iVar7 = (int)lVar8;
                  break;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < iVar13);
            }
            lenl[lVar3 + -1] = iVar11;
            len[lVar3 + -1] = iVar7 - local_88[lVar3 + -1];
            if (lenl[lVar3 + -1] == lenh[lVar3 + -1]) {
              local_b0[iVar2] = local_b0[local_b8];
              local_b8 = local_b8 + -1;
            }
            else {
              iVar2 = iVar2 + 1;
            }
            piVar16 = local_88;
          } while ((iVar6 < (int)uVar4) && (iVar6 = iVar6 + 1, iVar2 <= local_b8));
        }
        mod = 0;
        iVar6 = local_b8;
      }
      iVar15 = iVar15 + 1;
      uVar4 = *local_a8;
      cnt = iVar15;
      mc64ud_(&cnt,&mod,(int_t *)local_a8,local_78,iw4 + (int)uVar4,piVar16,len,fc,iw,
              (int_t *)&local_b4,numx,iw4,iw4 + (int)uVar4,local_50 + (int)(uVar4 * 2 + 1),
              iw4 + (long)(int)uVar4 * 3);
      iVar2 = (int)local_48;
      local_48 = (ulong)(iVar2 + 1);
    } while (iVar2 != local_6c);
  }
LAB_00114806:
  uVar4 = *local_a8;
  if (*numx != uVar4) {
    if (0 < (int)uVar4) {
      memset(w,0,(ulong)uVar4 << 2);
    }
    uVar4 = *local_a8;
    if (0 < (int)uVar4) {
      iVar6 = 0;
      lVar3 = 1;
      do {
        iVar7 = iVar6 + 1;
        iVar2 = iperm[lVar3 + -1];
        piVar16 = local_b0;
        if (iperm[lVar3 + -1] == 0) {
          iVar6 = iVar7;
          iVar2 = iVar7;
          piVar16 = piVar1;
        }
        piVar16[iVar2] = (int_t)lVar3;
        lVar3 = lVar3 + 1;
      } while ((ulong)uVar4 + 1 != lVar3);
    }
    uVar4 = *local_a8;
    if (0 < (int)uVar4) {
      iVar6 = 0;
      lVar3 = 1;
      do {
        if (w[lVar3 + -1] == 0) {
          lVar8 = (long)iVar6;
          iVar6 = iVar6 + 1;
          iperm[(long)iw[lVar8] + -1] = (int)lVar3;
        }
        lVar3 = lVar3 + 1;
      } while ((ulong)uVar4 + 1 != lVar3);
    }
  }
  return 0;
}

Assistant:

int_t mc64sd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *numx, int_t *w, 
	int_t *len, int_t *lenl, int_t *lenh, int_t *fc, int_t *iw, 
	int_t *iw4)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, l, ii, mod, cnt, num;
    double bval, bmin, bmax, rinf;
    int_t nval, wlen, idum1, idum2, idum3;
    extern /* Subroutine */ int_t
	mc64qd_(int_t *, int_t *, int_t *, int_t *, int_t *, double *,
		int_t *, double *), 
	mc64ud_(int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *, int_t *, int_t *, 
		int_t *, int_t *, int_t *, int_t *);

/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN, are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(k). The entries in each column must be */
/*   non-negative and ordered by decreasing value. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   bottleneck matching: IPERM(I) - 0 or row I is matched to column */
/*   IPERM(I). */
/* NUMX is an INT_T variable. On exit, it contains the cardinality */
/*   of the matching stored in IPERM. */
/* IW is an INT_T work array of length 10N. */
/* FC is an int_t array of length N that contains the list of */
/*   unmatched columns. */
/* LEN(J), LENL(J), LENH(J) are int_t arrays of length N that point */
/*   to entries in matrix column J. */
/*   In the matrix defined by the column parts IP(J)+LENL(J) we know */
/*   a matching does not exist; in the matrix defined by the column */
/*   parts IP(J)+LENH(J) we know one exists. */
/*   LEN(J) lies between LENL(J) and LENH(J) and determines the matrix */
/*   that is tested for a maximum matching. */
/* W is an int_t array of length N and contains the indices of the */
/*   columns for which LENL ne LENH. */
/* WLEN is number of indices stored in array W. */
/* IW is int_t work array of length N. */
/* IW4 is int_t work array of length 4N used by MC64U/UD. */
/*      EXTERNAL FD05AD,MC64QD,MC64UD */
/*      DOUBLE PRECISION FD05AD */
/* BMIN and BMAX are such that a maximum matching exists for the input */
/*   matrix in which all entries smaller than BMIN are dropped. */
/*   For BMAX, a maximum matching does not exist. */
/* BVAL is a value between BMIN and BMAX. */
/* CNT is the number of calls made to MC64U/UD so far. */
/* NUM is the cardinality of last matching found. */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --iw4;
    --iw;
    --fc;
    --lenh;
    --lenl;
    --len;
    --w;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Compute a first maximum matching from scratch on whole matrix. */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	fc[j] = j;
	iw[j] = 0;
	len[j] = ip[j + 1] - ip[j];
/* L20: */
    }
/* The first call to MC64U/UD */
    cnt = 1;
    mod = 1;
    *numx = 0;
    mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], numx,
	     n, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*n * 3 + 1]);
/* IW contains a maximum matching of length NUMX. */
    num = *numx;
    if (num != *n) {
/* Matrix is structurally singular */
	bmax = rinf;
    } else {
/* Matrix is structurally nonsingular, NUM=NUMX=N; */
/* Set BMAX just above the smallest of all the maximum absolute */
/* values of the columns */
	bmax = rinf;
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    bval = 0.f;
	    i__2 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__2; ++k) {
		if (a[k] > bval) {
		    bval = a[k];
		}
/* L25: */
	    }
	    if (bval < bmax) {
		bmax = bval;
	    }
/* L30: */
	}
	bmax *= 1.001f;
    }
/* Initialize BVAL,BMIN */
    bval = 0.f;
    bmin = 0.f;
/* Initialize LENL,LEN,LENH,W,WLEN according to BMAX. */
/* Set LEN(J), LENH(J) just after last entry in column J. */
/* Set LENL(J) just after last entry in column J with value ge BMAX. */
    wlen = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ip[j + 1] - ip[j];
	lenh[j] = l;
	len[j] = l;
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    if (a[k] < bmax) {
		goto L46;
	    }
/* L45: */
	}
/* Column J is empty or all entries are ge BMAX */
	k = ip[j + 1];
L46:
	lenl[j] = k - ip[j];
/* Add J to W if LENL(J) ne LENH(J) */
	if (lenl[j] == l) {
	    goto L48;
	}
	++wlen;
	w[wlen] = j;
L48:
	;
    }
/* Main loop */
    i__1 = *ne;
    for (idum1 = 1; idum1 <= i__1; ++idum1) {
	if (num == *numx) {
/* We have a maximum matching in IW; store IW in IPERM */
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		iperm[i__] = iw[i__];
/* L50: */
	    }
/* Keep going round this loop until matching IW is no longer maximum. */
	    i__2 = *ne;
	    for (idum2 = 1; idum2 <= i__2; ++idum2) {
		bmin = bval;
		if (bmax == bmin) {
		    goto L99;
		}
/* Find splitting value BVAL */
		mc64qd_(&ip[1], &lenl[1], &len[1], &w[1], &wlen, &a[1], &nval,
			 &bval);
		if (nval <= 1) {
		    goto L99;
		}
/* Set LEN such that all matrix entries with value lt BVAL are */
/* discarded. Store old LEN in LENH. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
		k = 1;
		i__3 = *n;
		for (idum3 = 1; idum3 <= i__3; ++idum3) {
		    if (k > wlen) {
			goto L71;
		    }
		    j = w[k];
		    i__4 = ip[j] + lenl[j];
		    for (ii = ip[j] + len[j] - 1; ii >= i__4; --ii) {
			if (a[ii] >= bval) {
			    goto L60;
			}
			i__ = irn[ii];
			if (iw[i__] != j) {
			    goto L55;
			}
/* Remove entry from matching */
			iw[i__] = 0;
			--num;
			fc[*n - num] = j;
L55:
			;
		    }
L60:
		    lenh[j] = len[j];
/* IP(J)+LEN(J)-1 is last entry in column ge BVAL */
		    len[j] = ii - ip[j] + 1;
/* If LENH(J) = LENL(J), remove J from W */
		    if (lenl[j] == lenh[j]) {
			w[k] = w[wlen];
			--wlen;
		    } else {
			++k;
		    }
/* L70: */
		}
L71:
		if (num < *numx) {
		    goto L81;
		}
/* L80: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L81:
	    mod = 1;
	} else {
/* We do not have a maximum matching in IW. */
	    bmax = bval;
/* BMIN is the bottleneck value of a maximum matching; */
/* for BMAX the matching is not maximum, so BMAX>BMIN */
/*          IF (BMAX .EQ. BMIN) GO TO 99 */
/* Find splitting value BVAL */
	    mc64qd_(&ip[1], &len[1], &lenh[1], &w[1], &wlen, &a[1], &nval, &
		    bval);
	    if (nval == 0 || bval == bmin) {
		goto L99;
	    }
/* Set LEN such that all matrix entries with value ge BVAL are */
/* inside matrix. Store old LEN in LENL. Do this for all columns W(K). */
/* Each step, either K is incremented or WLEN is decremented. */
	    k = 1;
	    i__2 = *n;
	    for (idum3 = 1; idum3 <= i__2; ++idum3) {
		if (k > wlen) {
		    goto L88;
		}
		j = w[k];
		i__3 = ip[j] + lenh[j] - 1;
		for (ii = ip[j] + len[j]; ii <= i__3; ++ii) {
		    if (a[ii] < bval) {
			goto L86;
		    }
/* L85: */
		}
L86:
		lenl[j] = len[j];
		len[j] = ii - ip[j];
		if (lenl[j] == lenh[j]) {
		    w[k] = w[wlen];
		    --wlen;
		} else {
		    ++k;
		}
/* L87: */
	    }
/* End of dummy loop; this point is never reached */
/* Set mode for next call to MC64U/UD */
L88:
	    mod = 0;
	}
	++cnt;
	mc64ud_(&cnt, &mod, n, &irn[1], ne, &ip[1], &len[1], &fc[1], &iw[1], &
		num, numx, &iw4[1], &iw4[*n + 1], &iw4[(*n << 1) + 1], &iw4[*
		n * 3 + 1]);
/* IW contains maximum matching of length NUM */
/* L90: */
    }
/* End of dummy loop; this point is never reached */
/* BMIN is bottleneck value of final matching */
L99:
    if (*numx == *n) {
	goto L1000;
    }
/* The matrix is structurally singular, complete IPERM */
/* W, IW are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	w[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    iw[k] = i__;
	} else {
	    j = iperm[i__];
	    w[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (w[j] != 0) {
	    goto L320;
	}
	++k;
	idum1 = iw[k];
	iperm[idum1] = j;
L320:
	;
    }
L1000:
    return 0;
}